

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetEventNumberIncludedFlag(LE_Detonation_PDU *this,KBOOL F)

{
  KUINT16 *pKVar1;
  byte bVar2;
  
  if ((((this->m_DetonationFlag2Union).m_ui8Flag & 2) == 0) == F) {
    bVar2 = (this->m_DetonationFlag2Union).m_ui8Flag & 0xfd | F * '\x02';
    (this->m_DetonationFlag2Union).m_ui8Flag = bVar2;
    if (-1 < (char)(this->m_DetonationFlag1Union).m_ui8Flag == (bVar2 != 0)) {
      (this->m_DetonationFlag1Union).m_ui8Flag =
           (this->m_DetonationFlag1Union).m_ui8Flag & 0x7f | (bVar2 != 0) << 7;
      pKVar1 = &(this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength;
      *pKVar1 = *pKVar1 + (ushort)(bVar2 != 0) * 2 + -1;
    }
    (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
         ((ushort)F * 4 + (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength) - 2;
  }
  return;
}

Assistant:

void LE_Detonation_PDU::SetEventNumberIncludedFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_DetonationFlag2Union.m_ui8EventNum )return;

    m_DetonationFlag2Union.m_ui8EventNum = F;

    SetFlag2Flag( m_DetonationFlag2Union.m_ui8Flag != 0 );

    if( F )
    {
        m_ui16PDULength += 2; // 2 = size of event number field
    }
    else
    {
        m_ui16PDULength -= 2;
    }
}